

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_set1_group_ids(SSL *ssl,uint16_t *group_ids,size_t num_group_ids)

{
  Span<const_unsigned_short> in;
  Span<const_unsigned_short> group_ids_00;
  bool bVar1;
  pointer pSVar2;
  bool local_59;
  undefined1 local_38 [8];
  Span<const_unsigned_short> span;
  size_t num_group_ids_local;
  uint16_t *group_ids_local;
  SSL *ssl_local;
  
  span.size_ = num_group_ids;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
  if (bVar1) {
    bssl::Span<const_unsigned_short>::Span
              ((Span<const_unsigned_short> *)local_38,group_ids,span.size_);
    group_ids_00.size_ = (size_t)span.data_;
    group_ids_00.data_ = (unsigned_short *)local_38;
    bVar1 = check_group_ids(group_ids_00);
    local_59 = false;
    if (bVar1) {
      pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
      in.size_ = (size_t)span.data_;
      in.data_ = (unsigned_short *)local_38;
      local_59 = bssl::Array<unsigned_short>::CopyFrom(&pSVar2->supported_group_list,in);
    }
    ssl_local._4_4_ = (uint)local_59;
  }
  else {
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_set1_group_ids(SSL *ssl, const uint16_t *group_ids,
                       size_t num_group_ids) {
  if (!ssl->config) {
    return 0;
  }
  auto span = Span(group_ids, num_group_ids);
  return check_group_ids(span) &&
         ssl->config->supported_group_list.CopyFrom(span);
}